

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int m_select_code_option(aec_stream *strm)

{
  uint32_t uVar1;
  aec_stream *in_RDI;
  internal_state *state;
  uint32_t se_len;
  uint32_t split_len;
  internal_state *strm_00;
  uint local_14;
  int local_4;
  
  strm_00 = in_RDI->state;
  if ((int)*(size_t *)&strm_00->id_len < 2) {
    local_14 = 0xffffffff;
  }
  else {
    local_14 = assess_splitting_option(_se_len);
  }
  uVar1 = assess_se_option(in_RDI);
  if (local_14 < strm_00->uncomp_len) {
    if (local_14 < uVar1) {
      local_4 = m_encode_splitting((aec_stream *)strm_00);
    }
    else {
      local_4 = m_encode_se(in_RDI);
    }
  }
  else if (uVar1 < strm_00->uncomp_len) {
    local_4 = m_encode_se(in_RDI);
  }
  else {
    local_4 = m_encode_uncomp((aec_stream *)strm_00);
  }
  return local_4;
}

Assistant:

static int m_select_code_option(struct aec_stream *strm)
{
    /**
       Decide which code option to use.
    */

    uint32_t split_len;
    uint32_t se_len;
    struct internal_state *state = strm->state;

    if (state->id_len > 1)
        split_len = assess_splitting_option(strm);
    else
        split_len = UINT32_MAX;
    se_len = assess_se_option(strm);

    if (split_len < state->uncomp_len) {
        if (split_len < se_len)
            return m_encode_splitting(strm);
        else
            return m_encode_se(strm);
    } else {
        if (state->uncomp_len <= se_len)
            return m_encode_uncomp(strm);
        else
            return m_encode_se(strm);
    }
}